

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O0

void __thiscall IndexingTest_GetLinearIndex_Test::TestBody(IndexingTest_GetLinearIndex_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff10;
  Vector3<int> *this_00;
  int *in_stack_ffffffffffffff18;
  Vector3<int> *this_01;
  char *in_stack_ffffffffffffff20;
  AssertionResult *this_02;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int line;
  char *in_stack_ffffffffffffff30;
  Type type;
  Vector3<int> *this_03;
  Message *in_stack_ffffffffffffff68;
  AssertHelper *in_stack_ffffffffffffff70;
  Vector3<int> local_84;
  int local_78;
  undefined4 local_74;
  AssertionResult local_70;
  uint local_5c;
  Vector3<int> local_38;
  Vector3<int> local_2c;
  int local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0x1f;
  this_03 = &local_2c;
  type = kFatalFailure;
  pica::Vector3<int>::Vector3(this_03,4,6,2);
  pica::Vector3<int>::Vector3(&local_38,type,3,1);
  local_20 = pica::getLinearIndex<pica::Vector3<int>>(this_03,&local_38);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(int *)in_stack_ffffffffffffff10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    in_stack_ffffffffffffff30 =
         testing::AssertionResult::failure_message((AssertionResult *)0x233869);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x2338c6);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x233934);
  if (local_5c == 0) {
    local_74 = 0x13a;
    this_00 = &local_84;
    pica::Vector3<int>::Vector3(this_00,0xc,5,8);
    this_01 = (Vector3<int> *)&stack0xffffffffffffff70;
    pica::Vector3<int>::Vector3(this_01,7,4,2);
    local_78 = pica::getLinearIndex<pica::Vector3<int>>(this_00,this_01);
    this_02 = &local_70;
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               &this_02->success_,&this_01->x,&this_00->x);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff2c);
    if (!bVar1) {
      testing::Message::Message((Message *)this_03);
      testing::AssertionResult::failure_message((AssertionResult *)0x233a36);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_03,type,in_stack_ffffffffffffff30,line,&this_02->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::Message::~Message((Message *)0x233a82);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x233ae7);
  }
  return;
}

Assistant:

TEST(IndexingTest, GetLinearIndex)
{
    ASSERT_EQ(6 * 2 * 2 + 2 * 3 + 1, getLinearIndex(Int3(4, 6, 2), Int3(2, 3, 1)));
    ASSERT_EQ(5 * 8 * 7 + 8 * 4 + 2, getLinearIndex(Int3(12, 5, 8), Int3(7, 4, 2)));
}